

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O2

Status __thiscall spvtools::opt::CopyPropagateArrays::Process(CopyPropagateArrays *this)

{
  Module *pMVar1;
  __uniq_ptr_data<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>,_true,_true>
  _Var2;
  long *plVar3;
  Instruction *this_00;
  bool bVar4;
  uint32_t uVar5;
  Instruction *insertion_point;
  Status SVar6;
  pointer puVar7;
  Instruction **ppIVar8;
  unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
  source_object;
  MemoryObject *local_40;
  undefined8 local_38;
  
  pMVar1 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  local_38 = *(pointer *)
              ((long)&(pMVar1->functions_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
              + 8);
  SVar6 = Failure;
  for (puVar7 = *(pointer *)
                 &(pMVar1->functions_).
                  super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                  ._M_impl; puVar7 != (pointer)local_38; puVar7 = puVar7 + 1) {
    _Var2.
    super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>.
    _M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
    .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl =
         (puVar7->_M_t).
         super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
    ;
    plVar3 = *(long **)((long)_Var2.
                              super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                              .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl
                       + 0x98);
    if (plVar3 != *(long **)((long)_Var2.
                                   super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                                   .super__Head_base<0UL,_spvtools::opt::Function_*,_false>.
                                   _M_head_impl + 0xa0)) {
      ppIVar8 = (Instruction **)(*plVar3 + 0x20);
      while (this_00 = *ppIVar8, this_00->opcode_ == OpVariable) {
        uVar5 = Instruction::type_id(this_00);
        bVar4 = IsPointerToArrayType(this,uVar5);
        if (bVar4) {
          insertion_point = FindStoreInstruction(this,this_00);
          if (insertion_point != (Instruction *)0x0) {
            FindSourceObjectIfPossible
                      ((CopyPropagateArrays *)&stack0xffffffffffffffc0,(Instruction *)this,this_00);
            if (local_40 != (MemoryObject *)0x0) {
              uVar5 = MemoryObject::GetPointerTypeId(local_40,this);
              bVar4 = CanUpdateUses(this,this_00,uVar5);
              if (bVar4) {
                PropagateObject(this,this_00,local_40,insertion_point);
                SVar6 = 1;
              }
            }
            std::
            unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
            ::~unique_ptr((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                           *)&stack0xffffffffffffffc0);
          }
        }
        ppIVar8 = &(this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      }
    }
  }
  return SVar6 ^ SuccessWithoutChange;
}

Assistant:

Pass::Status CopyPropagateArrays::Process() {
  bool modified = false;
  for (Function& function : *get_module()) {
    if (function.IsDeclaration()) {
      continue;
    }

    BasicBlock* entry_bb = &*function.begin();

    for (auto var_inst = entry_bb->begin();
         var_inst->opcode() == spv::Op::OpVariable; ++var_inst) {
      if (!IsPointerToArrayType(var_inst->type_id())) {
        continue;
      }

      // Find the only store to the entire memory location, if it exists.
      Instruction* store_inst = FindStoreInstruction(&*var_inst);

      if (!store_inst) {
        continue;
      }

      std::unique_ptr<MemoryObject> source_object =
          FindSourceObjectIfPossible(&*var_inst, store_inst);

      if (source_object != nullptr) {
        if (CanUpdateUses(&*var_inst, source_object->GetPointerTypeId(this))) {
          modified = true;
          PropagateObject(&*var_inst, source_object.get(), store_inst);
        }
      }
    }
  }
  return (modified ? Status::SuccessWithChange : Status::SuccessWithoutChange);
}